

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_int<int,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,int value,basic_format_specs<char> *spec)

{
  byte bVar1;
  byte bVar2;
  int_writer<int,_fmt::v5::basic_format_specs<char>_> local_20;
  
  bVar1 = (spec->super_core_format_specs).type;
  local_20.prefix_size = 0;
  if (value < 0) {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    bVar2 = (spec->super_core_format_specs).flags;
    local_20.abs_value = value;
    if ((bVar2 & 1) != 0) {
      local_20.prefix[0] = '+';
      if ((bVar2 & 2) == 0) {
        local_20.prefix[0] = ' ';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer =
       (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_> *)
       this;
  local_20.spec = spec;
  if (bVar1 < 100) {
    if (bVar1 < 0x58) {
      if (bVar1 == 0) {
LAB_001e9a7a:
        basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_dec(&local_20);
        return;
      }
      if (bVar1 == 0x42) {
LAB_001e9a58:
        basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_bin(&local_20);
        return;
      }
    }
    else {
      if (bVar1 == 0x58) {
LAB_001e9a6e:
        basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_hex(&local_20);
        return;
      }
      if (bVar1 == 0x62) goto LAB_001e9a58;
    }
  }
  else if (bVar1 < 0x6f) {
    if (bVar1 == 100) goto LAB_001e9a7a;
    if (bVar1 == 0x6e) {
      basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
      int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_num(&local_20);
      return;
    }
  }
  else {
    if (bVar1 == 0x6f) {
      basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
      int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_oct(&local_20);
      return;
    }
    if (bVar1 == 0x78) goto LAB_001e9a6e;
  }
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
  int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_error(&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }